

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::read_expression
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  Class *extent_index_00;
  uint16_t *puVar3;
  bool bVar4;
  string s;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_190;
  string local_180;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_160;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_100;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  Class local_c0;
  Class local_78;
  
  extent_index_00 = p;
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_f0,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
  bVar2 = read_nil(this,(Ptr *)&local_f0,write_index,(uint16_t *)extent_index_00,write);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
  bVar4 = true;
  if (!bVar2) {
    puVar3 = extent_index;
    if ((p == (Class *)0x0) || (bVar2 = std::operator!=(&p->str_opcode,Class::Expression), !bVar2))
    {
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1a0,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      Class::Class(&local_c0,ANY);
      bVar2 = read_variable(this,(Ptr *)&local_1a0,write_index,(uint16_t *)extent_index_00,write,
                            &local_c0);
      Class::~Class(&local_c0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a0._M_refcount);
      if (bVar2) {
        return true;
      }
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_110,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      bVar2 = read_reference(this,(Ptr *)&local_110,write_index,extent_index,write,ANY);
      p_Var1 = &local_110;
    }
    else {
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_190,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      Class::Class(&local_78,p);
      bVar2 = read_variable(this,(Ptr *)&local_190,write_index,(uint16_t *)extent_index_00,write,
                            &local_78);
      Class::~Class(&local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
      if (bVar2) {
        return true;
      }
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_100,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      bVar2 = read_reference(this,(Ptr *)&local_100,write_index,extent_index,write,p->type);
      p_Var1 = &local_100;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
    if (bVar2 == false) {
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_120,
                 &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      bVar2 = read_wildcard(this,(Ptr *)&local_120,write_index,puVar3,write);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
      if (!bVar2) {
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_130,
                   &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        bVar2 = read_tail_wildcard(this,(Ptr *)&local_130,write_index,puVar3,write);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
        if (!bVar2) {
          if ((p == (Class *)0x0) ||
             (bVar2 = std::operator!=(&p->str_opcode,Class::Expression), !bVar2)) {
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_150,
                       &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
            bVar2 = expression(this,(Ptr *)&local_150,ANY,write_index,extent_index,write);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150._M_refcount)
            ;
            if (!enforce || bVar2) {
              return bVar2;
            }
          }
          else {
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_140,
                       &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
            bVar2 = expression(this,(Ptr *)&local_140,p,write_index,extent_index,write);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140._M_refcount)
            ;
            if (!enforce || bVar2) {
              return bVar2;
            }
          }
          std::__cxx11::string::string
                    ((string *)&local_180," error: expected an expression",(allocator *)&local_e0);
          if (p != (Class *)0x0) {
            std::__cxx11::string::append((char *)&local_180);
            std::__cxx11::string::append((string *)&local_180);
            std::operator+(&local_e0," got: ",
                           &((node->
                             super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->cmd);
            std::__cxx11::string::append((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_e0);
          }
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_160,
                     &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
          set_error(this,&local_180,(Ptr *)&local_160);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount);
          std::__cxx11::string::~string((string *)&local_180);
          bVar4 = false;
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool Compiler::read_expression(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (read_nil(node, write_index, extent_index, write)) {
        return true;
    }

    if (p && p->str_opcode != Class::Expression) {
        if (read_variable(node, write_index, extent_index, write, *p)) {
            return true;
        }

        if (read_reference(node, write_index, extent_index, write, p->type)) {
            return true;
        }
    } else {
        if (read_variable(node, write_index, extent_index, write, Class())) {
            return true;
        }

        if (read_reference(node, write_index, extent_index, write, ANY)) {
            return true;
        }
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (p && p->str_opcode != Class::Expression) {
        if (expression(node, *p, write_index, extent_index, write)) {
            return true;
        }
    } else if (expression(node, ANY, write_index, extent_index, write)) {
        return true;
    }

    if (enforce) {
        std::string s = " error: expected an expression";

        if (p) {
            s += " of type: ";
            s += p->str_opcode;
            s += " got: " + node->cmd;
        }

        set_error(s, node);
        return false;
    }

    return false;
}